

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O2

void __thiscall GEO::geofile::make_coherent(geofile *this,bool *detailed)

{
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *this_00;
  int iVar1;
  _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> _Var2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree_iterator<std::pair<const_int,_int>_> _Var6;
  _Rb_tree_node_base *p_Var7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  _Self __tmp;
  _Self __tmp_4;
  _Self __tmp_5;
  _Rb_tree_header *p_Var9;
  pair<const_int,_int> local_110;
  _Self __tmp_3;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> changes;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_c0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  coherent_points(this);
  coherent_lines(this);
  if (*detailed == true) {
    changes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &changes._M_t._M_impl.super__Rb_tree_header._M_header;
    changes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    changes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    changes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_00 = &this->curve_loops_map;
    changes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         changes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((this->curve_loops_map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      p_Var9 = &(this->curve_loops_map)._M_t._M_impl.super__Rb_tree_header;
      _Var2 = std::
              prev<std::_Rb_tree_iterator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                        ((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                          )p_Var9,1);
      p_Var5 = (this->curve_loops_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while (p_Var5 != _Var2._M_node) {
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        __tmp_3._M_node = p_Var5;
        while ((_Rb_tree_header *)p_Var3 != p_Var9) {
          iVar1 = compare_vector((vector<int,_std::allocator<int>_> *)&p_Var5[1]._M_parent,
                                 (vector<int,_std::allocator<int>_> *)&p_Var3[1]._M_parent);
          if (iVar1 == 1) {
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var3);
            local_110.first = p_Var3[1]._M_color;
            local_110.second = __tmp_3._M_node[1]._M_color;
            std::
            _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
            ::_M_insert_unique<std::pair<int_const,int>>
                      ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                        *)&changes,&local_110);
            std::
            _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::erase(&this_00->_M_t,(key_type *)(p_Var3 + 1));
            _Var2 = std::
                    prev<std::_Rb_tree_iterator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                              ((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                )p_Var9,1);
          }
          else {
            p_Var4 = p_Var3;
            if (iVar1 == 2) {
              p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var3);
              local_110.second = -__tmp_3._M_node[1]._M_color;
              local_110.first = p_Var3[1]._M_color;
              std::
              _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              ::_M_insert_unique<std::pair<int_const,int>>
                        ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                          *)&changes,&local_110);
              std::
              _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::erase(&this_00->_M_t,(key_type *)(p_Var3 + 1));
              _Var2 = std::
                      prev<std::_Rb_tree_iterator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                                ((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                  )p_Var9,1);
            }
          }
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(__tmp_3._M_node);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::_Rb_tree(&local_60,&changes._M_t);
      adjust_curve_loops(this,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)&local_60);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_60);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::clear(&changes._M_t);
    }
    if ((this->plane_surfaces_map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      p_Var9 = &(this->plane_surfaces_map)._M_t._M_impl.super__Rb_tree_header;
      _Var6 = std::prev<std::_Rb_tree_iterator<std::pair<int_const,int>>>
                        ((_Rb_tree_iterator<std::pair<const_int,_int>_>)p_Var9,1);
      for (p_Var3 = (this->plane_surfaces_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var4 = p_Var3, p_Var3 != _Var6._M_node;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        while (p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4),
              (_Rb_tree_header *)p_Var7 != p_Var9) {
          p_Var4 = p_Var7;
          if (*(int *)&p_Var3[1].field_0x4 == *(int *)&p_Var7[1].field_0x4) {
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var7);
            local_110.first = p_Var7[1]._M_color;
            local_110.second = p_Var3[1]._M_color;
            std::
            _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
            ::_M_insert_unique<std::pair<int_const,int>>
                      ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                        *)&changes,&local_110);
            std::
            _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
            ::erase(&(this->plane_surfaces_map)._M_t,(key_type *)(p_Var7 + 1));
            _Var6 = std::prev<std::_Rb_tree_iterator<std::pair<int_const,int>>>
                              ((_Rb_tree_iterator<std::pair<const_int,_int>_>)p_Var9,1);
          }
        }
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::_Rb_tree(&local_90,&changes._M_t);
      adjust_plane_surfaces
                (this,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &local_90);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_90);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::clear(&changes._M_t);
    }
    if ((this->surface_loops_map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      p_Var9 = &(this->surface_loops_map)._M_t._M_impl.super__Rb_tree_header;
      _Var2 = std::
              prev<std::_Rb_tree_iterator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                        ((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                          )p_Var9,1);
      p_Var5 = (this->surface_loops_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while (p_Var5 != _Var2._M_node) {
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        __tmp_3._M_node = p_Var5;
        while ((_Rb_tree_header *)p_Var3 != p_Var9) {
          iVar1 = compare_vector((vector<int,_std::allocator<int>_> *)&p_Var5[1]._M_parent,
                                 (vector<int,_std::allocator<int>_> *)&p_Var3[1]._M_parent);
          if (iVar1 == 1) {
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var3);
            local_110.first = p_Var3[1]._M_color;
            local_110.second = __tmp_3._M_node[1]._M_color;
            std::
            _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
            ::_M_insert_unique<std::pair<int_const,int>>
                      ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                        *)&changes,&local_110);
            std::
            _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::erase(&this_00->_M_t,(key_type *)(p_Var3 + 1));
            _Var2 = std::
                    prev<std::_Rb_tree_iterator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                              ((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                )p_Var9,1);
          }
          else {
            p_Var4 = p_Var3;
            if (iVar1 == 2) {
              p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var3);
              local_110.second = -__tmp_3._M_node[1]._M_color;
              local_110.first = p_Var3[1]._M_color;
              std::
              _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
              ::_M_insert_unique<std::pair<int_const,int>>
                        ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                          *)&changes,&local_110);
              std::
              _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::erase(&this_00->_M_t,(key_type *)(p_Var3 + 1));
              _Var2 = std::
                      prev<std::_Rb_tree_iterator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>
                                ((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                                  )p_Var9,1);
            }
          }
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
        }
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(__tmp_3._M_node);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::_Rb_tree(&local_c0,&changes._M_t);
      adjust_surface_loops
                (this,(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      &local_c0);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_c0);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::clear(&changes._M_t);
    }
    for (p_Var3 = (this->physical_curves_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->physical_curves_map)._M_t._M_impl.super__Rb_tree_header
        ; p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      std::
      __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (*(undefined8 *)(p_Var3 + 2),p_Var3[2]._M_parent);
      _Var8 = std::
              __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        (*(undefined8 *)(p_Var3 + 2),p_Var3[2]._M_parent);
      std::vector<int,_std::allocator<int>_>::erase
                ((vector<int,_std::allocator<int>_> *)(p_Var3 + 2),(const_iterator)_Var8._M_current,
                 (const_iterator)p_Var3[2]._M_parent);
    }
    for (p_Var3 = (this->physical_surfaces_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
        ; (_Rb_tree_header *)p_Var3 !=
          &(this->physical_surfaces_map)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      std::
      __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (*(undefined8 *)(p_Var3 + 2),p_Var3[2]._M_parent);
      _Var8 = std::
              __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        (*(undefined8 *)(p_Var3 + 2),p_Var3[2]._M_parent);
      std::vector<int,_std::allocator<int>_>::erase
                ((vector<int,_std::allocator<int>_> *)(p_Var3 + 2),(const_iterator)_Var8._M_current,
                 (const_iterator)p_Var3[2]._M_parent);
    }
    for (p_Var3 = (this->physical_volumes_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 !=
        &(this->physical_volumes_map)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
      std::
      __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (*(undefined8 *)(p_Var3 + 2),p_Var3[2]._M_parent);
      _Var8 = std::
              __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        (*(undefined8 *)(p_Var3 + 2),p_Var3[2]._M_parent);
      std::vector<int,_std::allocator<int>_>::erase
                ((vector<int,_std::allocator<int>_> *)(p_Var3 + 2),(const_iterator)_Var8._M_current,
                 (const_iterator)p_Var3[2]._M_parent);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&changes._M_t);
  }
  return;
}

Assistant:

void GEO::geofile::make_coherent(const bool &detailed)
{
    // start_timer();                                                                      //DEBUG
    coherent_points();
    // std::cout << std::endl;                                                             //DEBUG
    // std::cout << "Time: coherent_points = " << get_microseconds()/1e3 << std::endl;     //DEBUG
    // start_timer();                                                                      //DEBUG
    coherent_lines();
    // std::cout << "Time: coherent_lines = " << get_microseconds()/1e3 << std::endl;      //DEBUG
    // start_timer();                                                                      //DEBUG
    if ( detailed==true)
    {
        std::map<int,int> changes;
        // ------- Search for duplicated curve loops --------
        if (!curve_loops_map.empty())
        {
            auto main_cl_loop_end = std::prev(curve_loops_map.end());
            for (auto main_cl_loop_it = curve_loops_map.begin();
                main_cl_loop_it != main_cl_loop_end;
                main_cl_loop_it++)
            {
                auto inner_cl_loop_end = curve_loops_map.end();
                auto cl_p_holder = main_cl_loop_it; cl_p_holder++;
                for (auto inner_cl_loop_it = cl_p_holder;
                    inner_cl_loop_it != inner_cl_loop_end;
                    inner_cl_loop_it++)
                {
                    int curve_type = compare_vector(main_cl_loop_it->second, inner_cl_loop_it->second);
                    switch (curve_type)
                    {
                    case 1/*identical*/:
                        cl_p_holder = inner_cl_loop_it; cl_p_holder--;
                        changes.insert({inner_cl_loop_it->first,main_cl_loop_it->first});
                        curve_loops_map.erase(inner_cl_loop_it->first);
                        inner_cl_loop_it = cl_p_holder;
                        inner_cl_loop_end = curve_loops_map.end();
                        main_cl_loop_end = std::prev(curve_loops_map.end());
                        break;
                    case 2/*reversed*/:
                        cl_p_holder = inner_cl_loop_it; cl_p_holder--;
                        changes.insert({inner_cl_loop_it->first,-main_cl_loop_it->first});
                        curve_loops_map.erase(inner_cl_loop_it->first);
                        inner_cl_loop_it = cl_p_holder;
                        inner_cl_loop_end = curve_loops_map.end();
                        main_cl_loop_end = std::prev(curve_loops_map.end());
                        break;
                    default:
                        break;
                    }
                }
            }
            adjust_curve_loops(changes);
            changes.clear();
        }
        // ------ Search for duplicated plane surfaces ------
        if (!plane_surfaces_map.empty())
        {
            auto main_ps_loop_end = std::prev(plane_surfaces_map.end());
            for (auto main_ps_loop_it = plane_surfaces_map.begin();
                main_ps_loop_it != main_ps_loop_end;
                main_ps_loop_it++)
            {
                auto inner_ps_loop_end = plane_surfaces_map.end();
                auto ps_p_holder = main_ps_loop_it; ps_p_holder++;
                for (auto inner_ps_loop_it = ps_p_holder;
                    inner_ps_loop_it != inner_ps_loop_end;
                    inner_ps_loop_it++)
                {
                    if (main_ps_loop_it->second == inner_ps_loop_it->second)
                    {
                        ps_p_holder = inner_ps_loop_it; ps_p_holder--;
                        changes.insert({ inner_ps_loop_it->first, main_ps_loop_it->first });
                        plane_surfaces_map.erase(inner_ps_loop_it->first);
                        inner_ps_loop_it = ps_p_holder;
                        inner_ps_loop_end = plane_surfaces_map.end();
                        main_ps_loop_end = std::prev(plane_surfaces_map.end());
                    }
                }
            }
            adjust_plane_surfaces(changes);
            changes.clear();
        }
        // ------ Search for duplicated surface loops -------
        if (!surface_loops_map.empty())
        {
            auto main_sur_loop_end = std::prev(surface_loops_map.end());
            for (auto main_sur_loop_it = surface_loops_map.begin();
                main_sur_loop_it != main_sur_loop_end;
                main_sur_loop_it++)
            {
                auto inner_sur_loop_end = surface_loops_map.end();
                auto sur_p_holder = main_sur_loop_it; sur_p_holder++;
                for (auto inner_sur_loop_it = sur_p_holder;
                    inner_sur_loop_it != inner_sur_loop_end;
                    inner_sur_loop_it++)
                {
                    int curve_type = compare_vector(main_sur_loop_it->second, inner_sur_loop_it->second);
                    switch (curve_type)
                    {
                    case 1/*identical*/:
                        sur_p_holder = inner_sur_loop_it; sur_p_holder--;
                        changes.insert({inner_sur_loop_it->first,main_sur_loop_it->first});
                        curve_loops_map.erase(inner_sur_loop_it->first);
                        inner_sur_loop_it = sur_p_holder;
                        inner_sur_loop_end = surface_loops_map.end();
                        main_sur_loop_end = std::prev(surface_loops_map.end());
                        break;
                    case 2/*reversed*/:
                        sur_p_holder = inner_sur_loop_it; sur_p_holder--;
                        changes.insert({inner_sur_loop_it->first,-main_sur_loop_it->first});
                        curve_loops_map.erase(inner_sur_loop_it->first);
                        inner_sur_loop_it = sur_p_holder;
                        inner_sur_loop_end = surface_loops_map.end();
                        main_sur_loop_end = std::prev(surface_loops_map.end());
                        break;
                    default:
                        break;
                    }
                }
            }
            adjust_surface_loops(changes);
            changes.clear();
        }
        // --- Search for duplicated physical elemements ----
        // Physical Curves
        auto pc_m_end = physical_curves_map.end();
        for ( auto i = physical_curves_map.begin();
            i != pc_m_end;
            i++)
        {
            std::sort(i->second.begin(),i->second.end());
            i->second.erase( unique(i->second.begin(),i->second.end() ), i->second.end());
        }
        // Physical Surfaces
        auto ps_m_end = physical_surfaces_map.end();
        for ( auto i = physical_surfaces_map.begin();
            i != ps_m_end;
            i++)
        {
            std::sort(i->second.begin(),i->second.end());
            i->second.erase( unique(i->second.begin(),i->second.end() ), i->second.end());
        }
        // Physical Volumes
        auto pv_m_end = physical_volumes_map.end();
        for ( auto i = physical_volumes_map.begin();
            i != pv_m_end;
            i++)
        {
            std::sort(i->second.begin(),i->second.end());
            i->second.erase( unique(i->second.begin(),i->second.end() ), i->second.end());
        }
    }
}